

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void set_cb(Fl_Button *param_1,void *param_2)

{
  int iVar1;
  Fl_Widget *this;
  Fl_Widget **ppFVar2;
  long lVar3;
  
  haderror = '\0';
  ppFVar2 = Fl_Group::array(&the_panel->super_Fl_Group);
  iVar1 = (the_panel->super_Fl_Group).children_;
  if (iVar1 != 0) {
    lVar3 = 0;
    do {
      this = ppFVar2[lVar3];
      if ((this->flags_ & 0x80) != 0) {
        Fl_Widget::do_callback(this,this,this->user_data_);
        if (haderror != '\0') {
          return;
        }
        *(byte *)&this->flags_ = (byte)this->flags_ & 0x7f;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != (int)lVar3);
  }
  return;
}

Assistant:

void set_cb(Fl_Button*, void*) {
  haderror = 0;
  Fl_Widget*const* a = the_panel->array();
  for (int i=the_panel->children(); i--;) {
    Fl_Widget* o = *a++;
    if (o->changed()) {
      o->do_callback();
      if (haderror) return;
      o->clear_changed();
    }
  }
}